

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void getCurTime(time_point start_time,string *msg)

{
  ostream *poVar1;
  
  std::chrono::_V2::steady_clock::now();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Time: ",6);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," msec\n",6);
  return;
}

Assistant:

void getCurTime(decltype(chrono::steady_clock::now()) start_time, string && msg) {
    auto cur = chrono::steady_clock::now();
    auto duration = std::chrono::duration_cast<std::chrono::milliseconds>(cur - start_time);
    cout << msg << endl;
    std::cout << "Time: " << duration.count() << " msec\n";
}